

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ics_impl.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_0::ICSImpl::StoreConfig(ICSImpl *this)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  time_point local_250;
  time_t local_248;
  time_t time_;
  string local_230 [32];
  long local_210;
  ofstream config_file;
  ICSImpl *this_local;
  
  (anonymous_namespace)::BeagleConfigPath_abi_cxx11_();
  std::ofstream::ofstream(&local_210,local_230,_S_out);
  std::__cxx11::string::~string(local_230);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  bVar4 = (bVar1 & 1) != 0;
  if (!bVar4) {
    local_250.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_248 = std::chrono::_V2::system_clock::to_time_t(&local_250);
    poVar2 = std::operator<<((ostream *)&local_210,"# Last Updated : ");
    pcVar3 = ctime(&local_248);
    std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<((ostream *)&local_210,"gateway=");
    poVar2 = std::operator<<(poVar2,(string *)&this->gateway_str);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&local_210,"dns1=");
    poVar2 = std::operator<<(poVar2,(string *)&this->dns_1_str);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&local_210,"dns2=");
    poVar2 = std::operator<<(poVar2,(string *)&this->dns_2_str);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  time_._0_4_ = (uint)bVar4;
  std::ofstream::~ofstream(&local_210);
  return;
}

Assistant:

void StoreConfig() {
    std::ofstream config_file(BeagleConfigPath());
    if (!config_file) {
      return;
    }

    // Updating the current configuration and adding timestamp
    std::time_t time_ =
        std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

    config_file << "# Last Updated : " << std::ctime(&time_);
    config_file << "gateway=" << gateway_str << std::endl;
    config_file << "dns1=" << dns_1_str << std::endl;
    config_file << "dns2=" << dns_2_str << std::endl;
  }